

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateSerializationLoop
               (Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,bool supports_arenas,string *utf8_check,string *loop_header,string *ptr,
               bool loop_via_iterators)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  char *pcVar2;
  ulong uVar3;
  AlphaNum *in_stack_fffffffffffffc38;
  AlphaNum *this_00;
  AlphaNum local_320;
  AlphaNum local_2f0;
  AlphaNum local_2c0;
  AlphaNum local_290;
  AlphaNum local_260;
  string local_230;
  AlphaNum local_210;
  AlphaNum local_1e0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  AlphaNum local_150;
  string local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool loop_via_iterators_local;
  string *ptr_local;
  string *loop_header_local;
  string *utf8_check_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_18;
  bool supports_arenas_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Printer *printer_local;
  
  local_39 = loop_via_iterators;
  psStack_38 = ptr;
  ptr_local = loop_header;
  loop_header_local = utf8_check;
  utf8_check_local._7_1_ = supports_arenas;
  pmStack_18 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)printer;
  strings::AlphaNum::AlphaNum(&local_90,"::google::protobuf::scoped_ptr<$map_classname$> entry;\n");
  strings::AlphaNum::AlphaNum(&local_c0,ptr_local);
  strings::AlphaNum::AlphaNum(&local_f0," {\n");
  StrCat_abi_cxx11_(&local_60,(protobuf *)&local_90,&local_c0,&local_f0,(AlphaNum *)loop_header);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  io::Printer::Print(printer,variables,pcVar2);
  std::__cxx11::string::~string((string *)&local_60);
  io::Printer::Indent((Printer *)variables_local);
  this = variables_local;
  pmVar1 = pmStack_18;
  strings::AlphaNum::AlphaNum(&local_150,"entry.reset($name$_.New$wrapper$(\n    ");
  strings::AlphaNum::AlphaNum(&local_180,psStack_38);
  strings::AlphaNum::AlphaNum(&local_1b0,"->first, ");
  strings::AlphaNum::AlphaNum(&local_1e0,psStack_38);
  strings::AlphaNum::AlphaNum(&local_210,"->second));\n$write_entry$;\n");
  StrCat_abi_cxx11_(&local_120,(protobuf *)&local_150,&local_180,&local_1b0,&local_1e0,&local_210,
                    in_stack_fffffffffffffc38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  io::Printer::Print((Printer *)this,pmVar1,pcVar2);
  std::__cxx11::string::~string((string *)&local_120);
  if ((utf8_check_local._7_1_ & 1) != 0) {
    io::Printer::Print((Printer *)variables_local,
                       "if (entry->GetArena() != NULL) {\n  entry.release();\n}\n");
  }
  uVar3 = std::__cxx11::string::empty();
  pmVar1 = variables_local;
  if ((uVar3 & 1) == 0) {
    this_00 = &local_260;
    strings::AlphaNum::AlphaNum(this_00,loop_header_local);
    strings::AlphaNum::AlphaNum(&local_290,"(");
    pcVar2 = "";
    if ((local_39 & 1) != 0) {
      pcVar2 = "&*";
    }
    strings::AlphaNum::AlphaNum(&local_2c0,pcVar2);
    strings::AlphaNum::AlphaNum(&local_2f0,psStack_38);
    strings::AlphaNum::AlphaNum(&local_320,");\n");
    StrCat_abi_cxx11_(&local_230,(protobuf *)this_00,&local_290,&local_2c0,&local_2f0,&local_320,
                      this_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    io::Printer::Print((Printer *)pmVar1,pcVar2);
    std::__cxx11::string::~string((string *)&local_230);
  }
  io::Printer::Outdent((Printer *)variables_local);
  io::Printer::Print((Printer *)variables_local,"}\n");
  return;
}

Assistant:

static void GenerateSerializationLoop(io::Printer* printer,
                                      const std::map<string, string>& variables,
                                      bool supports_arenas,
                                      const string& utf8_check,
                                      const string& loop_header,
                                      const string& ptr,
                                      bool loop_via_iterators) {
  printer->Print(variables,
      StrCat("::google::protobuf::scoped_ptr<$map_classname$> entry;\n",
             loop_header, " {\n").c_str());
  printer->Indent();

  printer->Print(variables, StrCat(
      "entry.reset($name$_.New$wrapper$(\n"
      "    ", ptr, "->first, ", ptr, "->second));\n"
      "$write_entry$;\n").c_str());

  // If entry is allocated by arena, its desctructor should be avoided.
  if (supports_arenas) {
    printer->Print(
        "if (entry->GetArena() != NULL) {\n"
        "  entry.release();\n"
        "}\n");
  }

  if (!utf8_check.empty()) {
    // If loop_via_iterators is true then ptr is actually an iterator, and we
    // create a pointer by prefixing it with "&*".
    printer->Print(
        StrCat(utf8_check, "(", (loop_via_iterators ? "&*" : ""), ptr, ");\n")
            .c_str());
  }

  printer->Outdent();
  printer->Print(
      "}\n");
}